

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixpoint.cpp
# Opt level: O0

int32_t fix_ATan2(int32_t i,int32_t j,int32_t q)

{
  __type _Var1;
  __type _Var2;
  double dVar3;
  int32_t q_local;
  int32_t j_local;
  int32_t i_local;
  
  _Var1 = std::pow<double,int>(2.0,q);
  _Var2 = std::pow<double,int>(2.0,q);
  dVar3 = atan2((double)i / _Var1,(double)j / _Var2);
  _Var1 = std::pow<double,int>(2.0,q);
  dVar3 = round((dVar3 / 6.283185307179586) * _Var1);
  return (int)dVar3;
}

Assistant:

int32_t fix_ATan2(int32_t i, int32_t j, int32_t q)
{
	return double2fix(rad2turn(atan2(fix2double(i, q), fix2double(j, q))), q);
}